

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,bool isStatic)

{
  bool bVar1;
  runtime_error *this_00;
  iterator this_01;
  reference ppVar2;
  byte in_DL;
  undefined8 *in_RDI;
  Value *value;
  value_type defaultValue;
  iterator it;
  CZString actualKey;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffee8;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffef0;
  const_iterator in_stack_fffffffffffffef8;
  uint7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  bool bVar3;
  CZString *__x;
  Value *in_stack_ffffffffffffff20;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_c8;
  _Base_ptr local_c0;
  undefined4 local_7c;
  _Self local_78;
  _Self local_70;
  CZString local_68 [4];
  byte local_19;
  Value *local_8;
  
  local_19 = in_DL & 1;
  if (((*(ushort *)(in_RDI + 1) & 0xff) != 0) && ((*(ushort *)(in_RDI + 1) & 0xff) != 7)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::resolveReference(): requires objectValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(ushort *)(in_RDI + 1) & 0xff) == 0) {
    Value((Value *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
          (ValueType)((ulong)in_stack_fffffffffffffef8._M_node >> 0x20));
    operator=((Value *)in_stack_fffffffffffffef0,(Value *)in_stack_fffffffffffffee8);
    ~Value(in_stack_ffffffffffffff20);
  }
  __x = local_68;
  CZString::CZString((CZString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                     (char *)in_stack_fffffffffffffef8._M_node,
                     (DuplicationPolicy)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  this_01 = std::
            map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::lower_bound((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                           *)in_stack_fffffffffffffee8,(key_type *)0x12ebc1);
  local_70._M_node = this_01._M_node;
  local_78._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)in_stack_fffffffffffffee8);
  bVar1 = std::operator!=(&local_70,&local_78);
  bVar3 = false;
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x12ec1b);
    bVar3 = CZString::operator==
                      ((CZString *)in_stack_fffffffffffffef8._M_node,
                       &in_stack_fffffffffffffef0->first);
  }
  if (bVar3 == false) {
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)this_01._M_node,__x,
               (Value *)(ulong)in_stack_ffffffffffffff00);
    in_stack_fffffffffffffef0 = (pair<const_Json::Value::CZString,_Json::Value> *)*in_RDI;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_c8,&local_70);
    local_c0 = (_Base_ptr)
               std::
               map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
               ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                         ((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                           *)in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
                          in_stack_fffffffffffffee8);
    local_70._M_node = local_c0;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x12ecf4);
    local_8 = &ppVar2->second;
    local_7c = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair(in_stack_fffffffffffffef0);
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x12ec46);
    local_8 = &ppVar2->second;
    local_7c = 1;
  }
  CZString::~CZString(&in_stack_fffffffffffffef0->first);
  return local_8;
}

Assistant:

Value& Value::resolveReference(const char* key, bool isStatic) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  CZString actualKey(
      key, isStatic ? CZString::noDuplication : CZString::duplicateOnCopy);
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, null);
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
#else
  return value_.map_->resolveReference(key, isStatic);
#endif
}